

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *
deqp::gls::LifetimeTests::details::createLifeTestGroup
          (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           *__return_storage_ptr__,TestContext *testCtx,LifeTestSpec *spec,
          vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
          *types)

{
  Type *type_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  TestCaseGroup *this;
  reference ppTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestNode *this_00;
  LifeTest *this_01;
  char *name;
  Type *type;
  __normal_iterator<deqp::gls::LifetimeTests::details::Type_*const_*,_std::vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>_>
  local_48;
  const_iterator it;
  vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
  *types_local;
  LifeTestSpec *spec_local;
  TestContext *testCtx_local;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *group;
  
  this = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(this,testCtx,spec->name,spec->name);
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&it._M_current + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            (__return_storage_ptr__,this);
  local_48._M_current =
       (Type **)std::
                vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
                ::begin(types);
  while( true ) {
    type = (Type *)std::
                   vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
                   ::end(types);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<deqp::gls::LifetimeTests::details::Type_*const_*,_std::vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>_>
                        *)&type);
    if (!bVar1) break;
    ppTVar4 = __gnu_cxx::
              __normal_iterator<deqp::gls::LifetimeTests::details::Type_*const_*,_std::vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>_>
              ::operator*(&local_48);
    type_00 = *ppTVar4;
    iVar2 = (*type_00->_vptr_Type[7])();
    if (((spec->needBind & 1U) == 0) ||
       (iVar3 = (*type_00->_vptr_Type[6])(), CONCAT44(extraout_var_00,iVar3) != 0)) {
      this_00 = &de::details::
                 UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::operator->
                           (&__return_storage_ptr__->
                             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                           )->super_TestNode;
      this_01 = (LifeTest *)operator_new(0xc0);
      LifeTest::LifeTest(this_01,(char *)CONCAT44(extraout_var,iVar2),
                         (char *)CONCAT44(extraout_var,iVar2),type_00,spec->func);
      tcu::TestNode::addChild(this_00,(TestNode *)this_01);
    }
    __gnu_cxx::
    __normal_iterator<deqp::gls::LifetimeTests::details::Type_*const_*,_std::vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>_>
    ::operator++(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

MovePtr<TestCaseGroup> createLifeTestGroup (TestContext& testCtx,
											const LifeTestSpec& spec,
											const vector<Type*>& types)
{
	MovePtr<TestCaseGroup> group(new TestCaseGroup(testCtx, spec.name, spec.name));

	for (vector<Type*>::const_iterator it = types.begin(); it != types.end(); ++it)
	{
		Type& type = **it;
		const char* name = type.getName();
		if (!spec.needBind || type.binder() != DE_NULL)
			group->addChild(new LifeTest(name, name, type, spec.func));
	}

	return group;
}